

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O0

ExtensionPtr __thiscall
plugin::StdPluginLib::GetExtension(StdPluginLib *this,InterfaceId *interface)

{
  bool bVar1;
  uint uVar2;
  size_type *this_00;
  element_type *peVar3;
  InterfaceId *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ExtensionPtr EVar5;
  InterfaceId local_60;
  __shared_ptr_access<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_40;
  shared_ptr<plugin::interfaces::IPluginInterface> *extension;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  *__range2;
  InterfaceId *interface_local;
  StdPluginLib *this_local;
  
  this_00 = &(interface->m_name)._M_string_length;
  __end2 = std::
           vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
           ::begin((vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
                    *)this_00);
  extension = (shared_ptr<plugin::interfaces::IPluginInterface> *)
              std::
              vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
              ::end((vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
                     *)this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<plugin::interfaces::IPluginInterface>_*,_std::vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>_>
                                *)&extension);
    if (!bVar1) {
      std::shared_ptr<plugin::interfaces::IPluginInterface>::shared_ptr
                ((shared_ptr<plugin::interfaces::IPluginInterface> *)this,(nullptr_t)0x0);
      _Var4._M_pi = extraout_RDX_00;
LAB_00112130:
      EVar5.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      EVar5.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (ExtensionPtr)
             EVar5.
             super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_40 = (__shared_ptr_access<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<plugin::interfaces::IPluginInterface>_*,_std::vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>_>
                  ::operator*(&__end2);
    peVar3 = std::
             __shared_ptr_access<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_40);
    InterfaceId::InterfaceId(&local_60,in_RDX);
    uVar2 = (*peVar3->_vptr_IPluginInterface[3])(peVar3,&local_60);
    InterfaceId::~InterfaceId(&local_60);
    if ((uVar2 & 1) != 0) {
      std::shared_ptr<plugin::interfaces::IPluginInterface>::shared_ptr
                ((shared_ptr<plugin::interfaces::IPluginInterface> *)this,
                 (shared_ptr<plugin::interfaces::IPluginInterface> *)local_40);
      _Var4._M_pi = extraout_RDX;
      goto LAB_00112130;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<plugin::interfaces::IPluginInterface>_*,_std::vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

ExtensionPtr const GetExtension(const plugin::InterfaceId& interface) const override
        {
            for(auto const& extension : m_extensions)
            {
                if(extension->RttiMatch(interface))
                {
                    return extension;
                }
            }

            return nullptr;
        }